

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

void __thiscall thread_pool::thread_pool(thread_pool *this,size_t n)

{
  bool bVar1;
  unique_lock<std::mutex> lock;
  anon_class_8_1_8991fb9c_for__M_head_impl local_50;
  thread local_48;
  unique_lock<std::mutex> local_40;
  
  (this->m_running)._M_base._M_i = true;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&this->m_threads,n,(allocator_type *)&local_40);
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_cv);
  std::condition_variable::condition_variable(&this->m_cvWait);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (&this->m_work);
  this->m_doingWork = 0;
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->m_mutex);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    local_50.this = this;
    std::thread::thread<thread_pool::thread_pool(unsigned_long)::_lambda()_1_,,void>
              (&local_48,&local_50);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&this->m_threads,&local_48);
    std::thread::~thread(&local_48);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

thread_pool(const size_t n)
    : m_running(true)
    , m_threads(n)
    , m_doingWork(0)
  {
    std::unique_lock<std::mutex> lock(m_mutex);
    for (size_t i=0; i<n; ++i)
      m_threads.push_back(std::move(std::thread([this]{ worker(); })));
  }